

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_MonsterMove
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *__assertion;
  AActor *actor;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003ff00e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ff00e;
        }
        goto LAB_003fefd6;
      }
    }
    else if (actor != (AActor *)0x0) goto LAB_003feffe;
    actor = (AActor *)0x0;
LAB_003fefd6:
    bVar1 = P_Move(actor);
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                      ,0x31c,
                      "int AF_AActor_MonsterMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,(uint)bVar1);
      iVar2 = 1;
    }
    return iVar2;
  }
LAB_003feffe:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003ff00e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x31b,
                "int AF_AActor_MonsterMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, MonsterMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(P_Move(self));
}